

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O0

Uint64 __thiscall
Diligent::CommandQueueVkImpl::Submit(CommandQueueVkImpl *this,VkSubmitInfo *InSubmitInfo)

{
  SoftwareQueueIndex CommandQueueId;
  VkQueue pVVar1;
  PFN_vkQueueSubmit p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  VkResult VVar5;
  atomic<unsigned_long> *paVar6;
  element_type *peVar7;
  Char *pCVar8;
  size_type sVar9;
  VkFence pVVar10;
  FenceVkImpl *pFVar11;
  bool local_171;
  lock_guard<Threading::SpinLock> local_150;
  SpinLockGuard SyncPointGuard;
  undefined1 local_130 [8];
  string msg_2;
  string msg_1;
  VkResult err;
  uint32_t SubmitCount;
  VkSubmitInfo SubmitInfo;
  undefined1 local_98 [4];
  uint32_t s;
  string msg;
  VkBaseInStructure *pStruct;
  undefined1 local_60 [8];
  SyncPointVkPtr NewSyncPoint;
  uint64_t FenceValue;
  lock_guard<std::mutex> QueueGuard;
  VkSubmitInfo *InSubmitInfo_local;
  CommandQueueVkImpl *this_local;
  
  QueueGuard._M_device = (mutex_type *)InSubmitInfo;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&FenceValue,&this->m_QueueMutex)
  ;
  paVar6 = &this->m_NextFenceValue;
  LOCK();
  NewSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          (paVar6->super___atomic_base<unsigned_long>)._M_i;
  (paVar6->super___atomic_base<unsigned_long>)._M_i =
       (paVar6->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  CreateSyncPoint((CommandQueueVkImpl *)local_60,(Uint64)this);
  std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::clear
            (&this->m_TempSignalSemaphores);
  peVar7 = std::__shared_ptr_access<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_60);
  SyncPointVk::GetSemaphores(peVar7,&this->m_TempSignalSemaphores);
  msg.field_2._8_8_ =
       *(undefined8 *)((long)&((QueueGuard._M_device)->super___mutex_base)._M_mutex + 8);
  do {
    if (msg.field_2._8_8_ == 0) {
LAB_0039e788:
      for (SubmitInfo.pSignalSemaphores._4_4_ = 0;
          SubmitInfo.pSignalSemaphores._4_4_ <
          (uint)QueueGuard._M_device[1].super___mutex_base._M_mutex.__data.__kind;
          SubmitInfo.pSignalSemaphores._4_4_ = SubmitInfo.pSignalSemaphores._4_4_ + 1) {
        std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::push_back
                  (&this->m_TempSignalSemaphores,
                   (value_type *)
                   (&(QueueGuard._M_device[1].super___mutex_base._M_mutex.__data.__list.__prev)->
                     __prev + SubmitInfo.pSignalSemaphores._4_4_));
      }
      memcpy(&err,QueueGuard._M_device,0x48);
      sVar9 = std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::size
                        (&this->m_TempSignalSemaphores);
      SubmitInfo.pCommandBuffers._0_4_ = (int)sVar9;
      SubmitInfo._56_8_ =
           std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::data
                     (&this->m_TempSignalSemaphores);
      p_Var2 = vkQueueSubmit;
      local_171 = true;
      if (((int)SubmitInfo.pNext == 0) && (local_171 = true, (int)SubmitInfo.pWaitDstStageMask == 0)
         ) {
        local_171 = (int)SubmitInfo.pCommandBuffers != 0;
      }
      pVVar1 = this->m_VkQueue;
      peVar7 = std::
               __shared_ptr_access<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_60);
      pVVar10 = SyncPointVk::GetFence(peVar7);
      VVar5 = (*p_Var2)(pVVar1,SUB14(local_171,0),(VkSubmitInfo *)&err,pVVar10);
      if (VVar5 != VK_SUCCESS) {
        FormatString<char[53]>
                  ((string *)((long)&msg_2.field_2 + 8),
                   (char (*) [53])"Failed to submit command buffer to the command queue");
        pCVar8 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar8,"Submit",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
                   ,0xbe);
        std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
      }
      pFVar11 = Diligent::RefCntAutoPtr::operator_cast_to_FenceVkImpl_
                          ((RefCntAutoPtr *)&this->m_pFence);
      if (pFVar11 == (FenceVkImpl *)0x0) {
        FormatString<char[45]>
                  ((string *)local_130,(char (*) [45])"Command queue fence has not been initialized"
                  );
        pCVar8 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar8,"Submit",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
                   ,0xc1);
        std::__cxx11::string::~string((string *)local_130);
      }
      pFVar11 = RefCntAutoPtr<Diligent::FenceVkImpl>::operator->(&this->m_pFence);
      _Var3 = NewSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
      CommandQueueId.m_Value = (this->m_CommandQueueId).m_Value;
      std::shared_ptr<Diligent::SyncPointVk>::shared_ptr
                ((shared_ptr<Diligent::SyncPointVk> *)&SyncPointGuard,
                 (shared_ptr<Diligent::SyncPointVk> *)local_60);
      FenceVkImpl::AddPendingSyncPoint
                (pFVar11,CommandQueueId,(Uint64)_Var3._M_pi,
                 (shared_ptr<Diligent::SyncPointVk> *)&SyncPointGuard);
      std::shared_ptr<Diligent::SyncPointVk>::~shared_ptr
                ((shared_ptr<Diligent::SyncPointVk> *)&SyncPointGuard);
      std::lock_guard<Threading::SpinLock>::lock_guard(&local_150,&this->m_LastSyncPointLock);
      std::shared_ptr<Diligent::SyncPointVk>::operator=
                (&this->m_LastSyncPoint,(shared_ptr<Diligent::SyncPointVk> *)local_60);
      std::lock_guard<Threading::SpinLock>::~lock_guard(&local_150);
      _Var3 = NewSyncPoint.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
      std::shared_ptr<Diligent::SyncPointVk>::~shared_ptr
                ((shared_ptr<Diligent::SyncPointVk> *)local_60);
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&FenceValue);
      return (Uint64)_Var3._M_pi;
    }
    if (*(int *)msg.field_2._8_8_ == 0x3b9df29b) {
      bVar4 = std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::empty
                        (&this->m_TempSignalSemaphores);
      if (!bVar4) {
        FormatString<char[60]>
                  ((string *)local_98,
                   (char (*) [60])"Can not append semaphores when timeline semaphores are used");
        pCVar8 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar8,"Submit",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
                   ,0xa8);
        std::__cxx11::string::~string((string *)local_98);
      }
      goto LAB_0039e788;
    }
    msg.field_2._8_8_ = *(undefined8 *)(msg.field_2._8_8_ + 8);
  } while( true );
}

Assistant:

Uint64 CommandQueueVkImpl::Submit(const VkSubmitInfo& InSubmitInfo)
{
    std::lock_guard<std::mutex> QueueGuard{m_QueueMutex};

    // Increment the value before submitting the buffer to be overly safe
    const uint64_t FenceValue = m_NextFenceValue.fetch_add(1);

    auto NewSyncPoint = CreateSyncPoint(FenceValue);

    m_TempSignalSemaphores.clear();
    NewSyncPoint->GetSemaphores(m_TempSignalSemaphores);

#ifdef DILIGENT_DEBUG
    const VkBaseInStructure* pStruct = static_cast<const VkBaseInStructure*>(InSubmitInfo.pNext);
    for (; pStruct != nullptr;)
    {
        if (pStruct->sType == VK_STRUCTURE_TYPE_TIMELINE_SEMAPHORE_SUBMIT_INFO)
        {
            VERIFY(m_TempSignalSemaphores.empty(), "Can not append semaphores when timeline semaphores are used");
            break;
        }
        pStruct = pStruct->pNext;
    }
#endif

    for (uint32_t s = 0; s < InSubmitInfo.signalSemaphoreCount; ++s)
        m_TempSignalSemaphores.push_back(InSubmitInfo.pSignalSemaphores[s]);

    VkSubmitInfo SubmitInfo         = InSubmitInfo;
    SubmitInfo.signalSemaphoreCount = static_cast<Uint32>(m_TempSignalSemaphores.size());
    SubmitInfo.pSignalSemaphores    = m_TempSignalSemaphores.data();

    const uint32_t SubmitCount =
        (SubmitInfo.waitSemaphoreCount != 0 ||
         SubmitInfo.commandBufferCount != 0 ||
         SubmitInfo.signalSemaphoreCount != 0) ?
        1 :
        0;

    auto err = vkQueueSubmit(m_VkQueue, SubmitCount, &SubmitInfo, NewSyncPoint->GetFence());
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to submit command buffer to the command queue");
    (void)err;

    VERIFY(m_pFence != nullptr, "Command queue fence has not been initialized");
    m_pFence->AddPendingSyncPoint(m_CommandQueueId, FenceValue, NewSyncPoint);

    // Update the last sync point
    {
        Threading::SpinLockGuard SyncPointGuard{m_LastSyncPointLock};
        m_LastSyncPoint = std::move(NewSyncPoint);
    }

    return FenceValue;
}